

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

int rgbcx::interp_half_5(int v0,int v1,int c0,int c1,bc1_approx_mode mode)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  undefined4 in_R8D;
  int local_4;
  
  switch(in_R8D) {
  case 0:
  case 3:
  default:
    local_4 = interp_half_5_6_ideal(in_EDX,in_ECX);
    break;
  case 1:
    local_4 = interp_half_5_nv(in_EDI,in_ESI);
    break;
  case 2:
    local_4 = interp_half_5_6_amd(in_EDX,in_ECX);
  }
  return local_4;
}

Assistant:

static inline int interp_half_5(int v0, int v1, int c0, int c1, bc1_approx_mode mode) 
	{ 
		assert(scale_5_to_8(v0) == c0 && scale_5_to_8(v1) == c1);
		switch (mode)
		{
		case bc1_approx_mode::cBC1NVidia: return interp_half_5_nv(v0, v1); 
		case bc1_approx_mode::cBC1AMD: return interp_half_5_6_amd(c0, c1);
		case bc1_approx_mode::cBC1Ideal: 
		case bc1_approx_mode::cBC1IdealRound4: 
		default:
			return interp_half_5_6_ideal(c0, c1);		
		}
	}